

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

void Lf_ManSetCutRefs(Lf_Man_t *p)

{
  uint *puVar1;
  ulong uVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_00;
  int v;
  long lVar5;
  
  if ((p->vMemSets).nSize * 0x1000 - (p->vFreeSets).nSize != 0) {
    printf("The number of used cutsets = %d.\n");
  }
  lVar5 = 0;
  while( true ) {
    if (p->pGia->nObjs <= lVar5) {
      return;
    }
    v = (int)lVar5;
    pGVar4 = Gia_ManObj(p->pGia,v);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar2 = *(ulong *)pGVar4;
    if ((uVar2 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar2) {
      if (pGVar4->Value != 0) {
        __assert_fail("pObj->Value == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                      ,0x5af,"void Lf_ManSetCutRefs(Lf_Man_t *)");
      }
      iVar3 = Gia_ObjIsBuf(pGVar4);
      if (iVar3 == 0) {
        iVar3 = Gia_ObjIsAndNotBuf(pGVar4 + -(uVar2 & 0x1fffffff));
        if (iVar3 != 0) {
          puVar1 = &pGVar4[-(uVar2 & 0x1fffffff)].Value;
          *puVar1 = *puVar1 + 1;
        }
        iVar3 = Gia_ObjIsAndNotBuf(pGVar4 + -(ulong)((uint)(uVar2 >> 0x20) & 0x1fffffff));
        if (iVar3 != 0) {
          puVar1 = &pGVar4[-(ulong)((uint)(uVar2 >> 0x20) & 0x1fffffff)].Value;
          *puVar1 = *puVar1 + 1;
        }
        p_00 = p->pGia;
        if ((p_00->pMuxes != (uint *)0x0) && (p_00->pMuxes[lVar5] != 0)) {
          pObj = Gia_ObjFanin2(p_00,pGVar4);
          iVar3 = Gia_ObjIsAndNotBuf(pObj);
          p_00 = p->pGia;
          if (iVar3 != 0) {
            pGVar4 = Gia_ObjFanin2(p_00,pGVar4);
            pGVar4->Value = pGVar4->Value + 1;
            p_00 = p->pGia;
          }
        }
        if ((p_00->pSibls != (int *)0x0) && (p_00->pSibls[lVar5] != 0)) {
          pGVar4 = Gia_ObjSiblObj(p_00,v);
          iVar3 = Gia_ObjIsAndNotBuf(pGVar4);
          if (iVar3 != 0) {
            pGVar4 = Gia_ObjSiblObj(p->pGia,v);
            pGVar4->Value = pGVar4->Value + 1;
          }
        }
      }
    }
    lVar5 = lVar5 + 1;
  }
  return;
}

Assistant:

void Lf_ManSetCutRefs( Lf_Man_t * p )
{
    Gia_Obj_t * pObj; int i;
    if ( Vec_PtrSize(&p->vMemSets) * (1 << LF_LOG_PAGE) != Vec_IntSize(&p->vFreeSets) )
        printf( "The number of used cutsets = %d.\n", Vec_PtrSize(&p->vMemSets) * (1 << LF_LOG_PAGE) - Vec_IntSize(&p->vFreeSets) );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        assert( pObj->Value == 0 );
        if ( Gia_ObjIsBuf(pObj) )
            continue;
        if ( Gia_ObjIsAndNotBuf(Gia_ObjFanin0(pObj)) )
            Gia_ObjFanin0(pObj)->Value++;
        if ( Gia_ObjIsAndNotBuf(Gia_ObjFanin1(pObj)) )
            Gia_ObjFanin1(pObj)->Value++;
        if ( Gia_ObjIsMuxId(p->pGia, i) && Gia_ObjIsAndNotBuf(Gia_ObjFanin2(p->pGia, pObj)) )
            Gia_ObjFanin2(p->pGia, pObj)->Value++;
        if ( Gia_ObjSibl(p->pGia, i) && Gia_ObjIsAndNotBuf(Gia_ObjSiblObj(p->pGia, i)) )
            Gia_ObjSiblObj(p->pGia, i)->Value++;
    }
}